

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

BOOL CONTEXT_SetThreadContext(DWORD dwProcessId,pthread_t self,CONTEXT *lpContext)

{
  uint uVar1;
  FILE *pFVar2;
  DWORD DVar3;
  long lVar4;
  uint *puVar5;
  int *piVar6;
  char *pcVar7;
  DWORD64 local_d0;
  pt_regs ptrace_registers;
  BOOL ret;
  CONTEXT *lpContext_local;
  pthread_t self_local;
  DWORD dwProcessId_local;
  
  ptrace_registers.ss._4_4_ = 0;
  if (lpContext == (CONTEXT *)0x0) {
    if (PAL_InitializeChakraCoreCalled) {
      SetLastError(0x3e6);
      return ptrace_registers.ss._4_4_;
    }
    abort();
  }
  DVar3 = GetCurrentProcessId();
  if (dwProcessId == DVar3) {
    fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/context.cpp"
            ,0x1e9,"0","");
    fflush(_stderr);
    abort();
  }
  if ((lpContext->ContextFlags & 3) != 0) {
    lVar4 = ptrace(PTRACE_GETREGS,(ulong)dwProcessId,&local_d0,0);
    if (lVar4 == -1) {
      fprintf(_stderr,"] %s %s:%d","CONTEXT_SetThreadContext",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/context.cpp"
              ,0x1fa);
      pFVar2 = _stderr;
      puVar5 = (uint *)__errno_location();
      uVar1 = *puVar5;
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      fprintf(pFVar2,"Failed ptrace(PT_GETREGS, processId:%d) errno:%d (%s)\n",(ulong)dwProcessId,
              (ulong)uVar1,pcVar7);
      SetLastError(0x54f);
      return ptrace_registers.ss._4_4_;
    }
    if ((lpContext->ContextFlags & 1) != 0) {
      ptrace_registers.r12 = lpContext->Rbp;
      ptrace_registers.orig_rax = lpContext->Rip;
      ptrace_registers.rip = (unsigned_long)lpContext->SegCs;
      ptrace_registers.cs = (unsigned_long)lpContext->EFlags;
      ptrace_registers.eflags = lpContext->Rsp;
    }
    if ((lpContext->ContextFlags & 2) != 0) {
      ptrace_registers.rsi = lpContext->Rdi;
      ptrace_registers.rdx = lpContext->Rsi;
      ptrace_registers.rbp = lpContext->Rbx;
      ptrace_registers.rcx = lpContext->Rdx;
      ptrace_registers.rax = lpContext->Rcx;
      ptrace_registers.r8 = lpContext->Rax;
      ptrace_registers.r9 = lpContext->R8;
      ptrace_registers.r10 = lpContext->R9;
      ptrace_registers.r11 = lpContext->R10;
      ptrace_registers.rbx = lpContext->R11;
      ptrace_registers.r13 = lpContext->R12;
      ptrace_registers.r14 = lpContext->R13;
      ptrace_registers.r15 = lpContext->R14;
      local_d0 = lpContext->R15;
    }
    lVar4 = ptrace(PTRACE_SETREGS,(ulong)dwProcessId,&local_d0,0);
    if (lVar4 == -1) {
      fprintf(_stderr,"] %s %s:%d","CONTEXT_SetThreadContext",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/context.cpp"
              ,0x219);
      pFVar2 = _stderr;
      puVar5 = (uint *)__errno_location();
      uVar1 = *puVar5;
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      fprintf(pFVar2,"Failed ptrace(PT_SETREGS, processId:%d) errno:%d (%s)\n",(ulong)dwProcessId,
              (ulong)uVar1,pcVar7);
      SetLastError(0x54f);
      return ptrace_registers.ss._4_4_;
    }
  }
  return 1;
}

Assistant:

BOOL
CONTEXT_SetThreadContext(
           DWORD dwProcessId,
           pthread_t self,
           CONST CONTEXT *lpContext)
{
    BOOL ret = FALSE;

    if (lpContext == NULL)
    {
        ERROR("Invalid lpContext parameter value\n");
        SetLastError(ERROR_NOACCESS);
        goto EXIT;
    }

    if (dwProcessId != GetCurrentProcessId())
    {
        // GetThreadContext() of a thread in another process
        ASSERT("Cross-process GetThreadContext() is not supported\n");
        SetLastError(ERROR_NOACCESS);
        goto EXIT;
    }

    if (self != pthread_self())
    {
        // hThread is in the current process, but isn't the current
        // thread.  Extract the CONTEXT from the Mach thread.

        mach_port_t mptPort;

        mptPort = pthread_mach_thread_np(self);

        ret = (CONTEXT_SetThreadContextOnPort(mptPort, lpContext) == KERN_SUCCESS);
    }
    else
    {
        MachSetThreadContext(const_cast<CONTEXT *>(lpContext));
        ASSERT("MachSetThreadContext should never return\n");
    }

EXIT:
    return ret;
}